

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# utilTruth.h
# Opt level: O0

int Abc_TtIsUnate(word *t,int nVars)

{
  int iVar1;
  int local_20;
  int i;
  int nVars_local;
  word *t_local;
  
  local_20 = 0;
  while( true ) {
    if (nVars <= local_20) {
      return 1;
    }
    iVar1 = Abc_TtNegVar(t,nVars,local_20);
    if ((iVar1 == 0) && (iVar1 = Abc_TtPosVar(t,nVars,local_20), iVar1 == 0)) break;
    local_20 = local_20 + 1;
  }
  return 0;
}

Assistant:

static inline int Abc_TtIsUnate( word * t, int nVars )
{
    int i;
    for ( i = 0; i < nVars; i++ )
        if ( !Abc_TtNegVar(t, nVars, i) && !Abc_TtPosVar(t, nVars, i) )
            return 0;
    return 1;
}